

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

enable_if_t<HasSize<span<const_Point3<float>_>_>::value_&&_HasData<span<const_Point3<float>_>_>::value,_std::ostream_&>
 pbrt::detail::operator<<(ostream *os,span<const_pbrt::Point3<float>_> *v)

{
  size_t sVar1;
  ostream *poVar2;
  span<const_pbrt::Point3<float>_> *in_RSI;
  ostream *in_RDI;
  Point3<float> *in_stack_00000008;
  ostream *in_stack_00000010;
  size_t i;
  Point3<float> *ptr;
  ulong local_20;
  
  std::operator<<(in_RDI,"[ ");
  pstd::span<const_pbrt::Point3<float>_>::data(in_RSI);
  local_20 = 0;
  while( true ) {
    sVar1 = pstd::span<const_pbrt::Point3<float>_>::size(in_RSI);
    if (sVar1 <= local_20) break;
    pbrt::operator<<(in_stack_00000010,in_stack_00000008);
    sVar1 = pstd::span<const_pbrt::Point3<float>_>::size(in_RSI);
    if (local_20 < sVar1 - 1) {
      std::operator<<(in_RDI,", ");
    }
    local_20 = local_20 + 1;
  }
  poVar2 = std::operator<<(in_RDI," ]");
  return poVar2;
}

Assistant:

inline std::enable_if_t<HasSize<T>::value && HasData<T>::value, std::ostream &>
operator<<(std::ostream &os, const T &v) {
    os << "[ ";
    auto ptr = v.data();
    for (size_t i = 0; i < v.size(); ++i) {
        os << ptr[i];
        if (i < v.size() - 1)
            os << ", ";
    }
    return os << " ]";
}